

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * libtorrent::remove_extension(string *__return_storage_ptr__,string *f)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  
  __s = (f->_M_dataplus)._M_p;
  pcVar1 = strrchr(__s,0x2f);
  pcVar2 = strrchr(__s,0x2e);
  if (((pcVar2 < pcVar1) || (pcVar2 == (char *)0x0)) || (pcVar2 == __s)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,__s,__s + f->_M_string_length);
  }
  else {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)f);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string remove_extension(std::string const& f)
	{
		char const* slash = std::strrchr(f.c_str(), '/');
#ifdef TORRENT_WINDOWS
		slash = std::max((char const*)std::strrchr(f.c_str(), '\\'), slash);
#endif
		char const* ext = std::strrchr(f.c_str(), '.');
		// if we don't have an extension, just return f
		if (ext == nullptr || ext == &f[0] || (slash != nullptr && ext < slash)) return f;
		return f.substr(0, aux::numeric_cast<std::size_t>(ext - &f[0]));
	}